

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O2

void __thiscall StringPieceUtilTestSplitStringPiece::Run(StringPieceUtilTestSplitStringPiece *this)

{
  Test *pTVar1;
  bool bVar2;
  vector<StringPiece,_std::allocator<StringPiece>_> list;
  string input;
  StringPiece local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"a:b:c",(allocator<char> *)&list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x1a,"list.size() == 3");
  pTVar1 = g_current_test;
  local_40.str_ = "a";
  local_40.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x1c,"list[0] == \"a\"");
  pTVar1 = g_current_test;
  local_40.str_ = "b";
  local_40.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x1d,"list[1] == \"b\"");
  pTVar1 = g_current_test;
  local_40.str_ = "c";
  local_40.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 2,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x1e,"list[2] == \"c\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>((string *)&input,"",(allocator<char> *)&list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x25,"list.size() == 1");
  pTVar1 = g_current_test;
  local_40.str_ = "";
  local_40.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x27,"list[0] == \"\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>((string *)&input,"a",(allocator<char> *)&list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x2e,"list.size() == 1");
  pTVar1 = g_current_test;
  local_40.str_ = "a";
  local_40.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x30,"list[0] == \"a\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>((string *)&input,":",(allocator<char> *)&list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x37,"list.size() == 2");
  pTVar1 = g_current_test;
  local_40.str_ = "";
  local_40.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x39,"list[0] == \"\"");
  pTVar1 = g_current_test;
  local_40.str_ = "";
  local_40.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x3a,"list[1] == \"\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,":a:b:c:",(allocator<char> *)&list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  testing::Test::Check
            (g_current_test,
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x41,"list.size() == 5");
  pTVar1 = g_current_test;
  local_40.str_ = "";
  local_40.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x43,"list[0] == \"\"");
  pTVar1 = g_current_test;
  local_40.str_ = "a";
  local_40.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x44,"list[1] == \"a\"");
  pTVar1 = g_current_test;
  local_40.str_ = "b";
  local_40.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 2,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x45,"list[2] == \"b\"");
  pTVar1 = g_current_test;
  local_40.str_ = "c";
  local_40.len_ = 1;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 3,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x46,"list[3] == \"c\"");
  pTVar1 = g_current_test;
  local_40.str_ = "";
  local_40.len_ = 0;
  bVar2 = StringPiece::operator==
                    (list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 4,&local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x47,"list[4] == \"\"");
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

TEST(StringPieceUtilTest, SplitStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ(list.size(), 3);

    EXPECT_EQ(list[0], "a");
    EXPECT_EQ(list[1], "b");
    EXPECT_EQ(list[2], "c");
  }

  {
    string empty("");
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "");
  }

  {
    string one("a");
    vector<StringPiece> list = SplitStringPiece(one, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "a");
  }

  {
    string sep_only(":");
    vector<StringPiece> list = SplitStringPiece(sep_only, ':');

    EXPECT_EQ(list.size(), 2);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "");
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(list.size(), 5);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "a");
    EXPECT_EQ(list[2], "b");
    EXPECT_EQ(list[3], "c");
    EXPECT_EQ(list[4], "");
  }
}